

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoPlayer.cpp
# Opt level: O2

void __thiscall DemoPlayer::play(DemoPlayer *this,uint songNumber)

{
  Bit8u *pBVar1;
  QString *s2;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_28;
  
  QList<QMidiEvent>::clear(&(this->midiEventList).super_QVector<QMidiEvent>);
  if (songNumber < this->demoSongCount) {
    this->currentSongNumber = songNumber;
    pBVar1 = getSongData(this,songNumber);
    this->songData = pBVar1;
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    s2 = (QString *)QString::setNum((ulonglong)&local_48,songNumber + 1);
    operator+((QString *)&local_78,"Demo ",s2);
    operator+((QString *)&local_60,(QString *)&local_78,": ");
    getSongName((QString *)&local_90,this->songData);
    operator+((QString *)&local_28,(QString *)&local_60,(QString *)&local_90);
    QString::operator=(&this->midiStreamName,(QString *)&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    this->midiTick = (ulong)*(ushort *)(this->songData + 0x10) * 2000;
    configureSynth(this);
    parseMIDIEvents(this,this->songData + 0x120);
    SMFDriver::start(&this->smfDriver,&this->super_MidiStreamSource);
  }
  return;
}

Assistant:

void DemoPlayer::play(uint songNumber) {
	midiEventList.clear();
	if (demoSongCount <= songNumber) return;
	currentSongNumber = songNumber;
	songData = getSongData(songNumber);
	midiStreamName = "Demo " + QString().setNum(songNumber + 1) + ": " + getSongName(songData);
	midiTick = computeMidiTick(songData);
	configureSynth();
	parseMIDIEvents(&songData[MIDI_STREAM_OFFSET]);
	smfDriver.start(this);
}